

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O2

void __thiscall test_test::test_char_neq_compare::test_method(test_char_neq_compare *this)

{
  unit_test_log_t *puVar1;
  char rcca2 [6];
  char rca1 [6];
  char lcca2 [6];
  unit_test_log_t local_528;
  undefined1 local_520;
  undefined1 *local_518;
  char *local_510;
  char *rccpc4;
  char *rccp3;
  char lca1 [6];
  char *lccpc4;
  char *lccp3;
  char *local_4e0;
  char *local_4d8;
  const_string local_4d0;
  const_string local_4c0;
  char *local_4b0;
  char *local_4a8;
  const_string local_4a0;
  const_string local_490;
  char *local_480;
  char *local_478;
  const_string local_470;
  const_string local_460;
  char *local_450;
  char *local_448;
  const_string local_440;
  const_string local_430;
  char *local_420;
  char *local_418;
  const_string local_410;
  const_string local_400;
  char *local_3f0;
  char *local_3e8;
  const_string local_3e0;
  const_string local_3d0;
  char *local_3c0;
  char *local_3b8;
  const_string local_3b0;
  const_string local_3a0;
  char *local_390;
  char *local_388;
  const_string local_380;
  const_string local_370;
  char *local_360;
  char *local_358;
  const_string local_350;
  const_string local_340;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  char *local_300;
  char *local_2f8;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  char *local_210;
  char *local_208;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  char *local_1b0;
  char *local_1a8;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  builtin_strncpy(lca1,"Hello",6);
  builtin_strncpy(rca1,"World",6);
  builtin_strncpy(lcca2,"Hello",6);
  builtin_strncpy(rcca2,"World",6);
  lccp3 = "Hello";
  rccp3 = "World";
  lccpc4 = "Hello";
  rccpc4 = "World";
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)"World",&local_40,0x6f,&local_50);
  puVar1 = &local_528;
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_60,0x6f,1,3,"Hello","\"Hello\"","World","\"World\"");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_70,0x70,&local_80);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_88 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_90,0x70,1,3,"Hello","\"Hello\"",rca1,"rca1");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a0,0x71,&local_b0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_b8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_c0,0x71,1,3,"Hello","\"Hello\"",rcca2,"rcca2");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d0,0x72,&local_e0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_e8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_f0,0x72,1,3,"Hello","\"Hello\"",&rccp3,"rccp3");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_100,0x73,&local_110);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_118 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_120,0x73,1,3,"Hello","\"Hello\"",&rccpc4,"rccpc4");
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_130,0x75,&local_140);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_148 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_150,0x75,1,3,lca1,"lca1","World","\"World\"");
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_160,0x76,&local_170);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_178 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_180,0x76,1,3,lca1,"lca1",rca1,"rca1");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_190,0x77,&local_1a0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1a8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_1b0,0x77,1,3,lca1,"lca1",rcca2,"rcca2");
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1c0,0x78,&local_1d0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1d8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_1e0,0x78,1,3,lca1,"lca1",&rccp3,"rccp3");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1f0,0x79,&local_200);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_208 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_210,0x79,1,3,lca1,"lca1",&rccpc4,"rccpc4");
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_220,0x7b,&local_230);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_238 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_240,0x7b,1,3,lcca2,"lcca2","World","\"World\"");
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_250,0x7c,&local_260);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_268 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_270,0x7c,1,3,lcca2,"lcca2",rca1,"rca1");
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_280,0x7d,&local_290);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_298 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
            (puVar1,&local_2a0,0x7d,1,3,lcca2,"lcca2",rcca2,"rcca2");
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2b0,0x7e,&local_2c0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2c8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_2d0,0x7e,1,3,lcca2,"lcca2",&rccp3,"rccp3");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2e0,0x7f,&local_2f0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2f8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
            (puVar1,&local_300,0x7f,1,3,lcca2,"lcca2",&rccpc4,"rccpc4");
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_310,0x81,&local_320);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_328 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_330,0x81,1,3,&lccp3,"lccp3","World","\"World\"");
  local_340.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_340.m_end = "";
  local_350.m_begin = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_340,0x82,&local_350);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_358 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_360,0x82,1,3,&lccp3,"lccp3",rca1,"rca1");
  local_370.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_370.m_end = "";
  local_380.m_begin = "";
  local_380.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_370,0x83,&local_380);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_388 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_390,0x83,1,3,&lccp3,"lccp3",rcca2,"rcca2");
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3a0,0x84,&local_3b0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3b8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
            (puVar1,&local_3c0,0x84,1,3,&lccp3,"lccp3",&rccp3,"rccp3");
  local_3d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3d0.m_end = "";
  local_3e0.m_begin = "";
  local_3e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3d0,0x85,&local_3e0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3e8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
            (puVar1,&local_3f0,0x85,1,3,&lccp3,"lccp3",&rccpc4,"rccpc4");
  local_400.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_400.m_end = "";
  local_410.m_begin = "";
  local_410.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_400,0x87,&local_410);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_418 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_420,0x87,1,3,&lccpc4,"lccpc4","World","\"World\"");
  local_430.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_430.m_end = "";
  local_440.m_begin = "";
  local_440.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_430,0x88,&local_440);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_448 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_450,0x88,1,3,&lccpc4,"lccpc4",rca1,"rca1");
  local_460.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_460.m_end = "";
  local_470.m_begin = "";
  local_470.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_460,0x89,&local_470);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_478 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
            (puVar1,&local_480,0x89,1,3,&lccpc4,"lccpc4",rcca2,"rcca2");
  local_490.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_490.m_end = "";
  local_4a0.m_begin = "";
  local_4a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_490,0x8a,&local_4a0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4a8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
            (puVar1,&local_4b0,0x8a,1,3,&lccpc4,"lccpc4",&rccp3,"rccp3");
  local_4c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4c0.m_end = "";
  local_4d0.m_begin = "";
  local_4d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_4c0,0x8b,&local_4d0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4d8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
            (&local_528,&local_4e0,0x8b,1,3,&lccpc4,"lccpc4",&rccpc4,"rccpc4");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_char_neq_compare)
{
    char lca1[] = "Hello";
    char rca1[] = "World";
    const char lcca2[] = "Hello", rcca2[] = "World";
    const char *lccp3 = "Hello";
    const char *rccp3 = "World";
    const char * const lccpc4 = "Hello";
    const char * const rccpc4 = "World";

    BOOST_CHECK_NE("Hello", "World");
    BOOST_CHECK_NE("Hello", rca1);
    BOOST_CHECK_NE("Hello", rcca2);
    BOOST_CHECK_NE("Hello", rccp3);
    BOOST_CHECK_NE("Hello", rccpc4);

    BOOST_CHECK_NE(lca1, "World");
    BOOST_CHECK_NE(lca1, rca1);
    BOOST_CHECK_NE(lca1, rcca2);
    BOOST_CHECK_NE(lca1, rccp3);
    BOOST_CHECK_NE(lca1, rccpc4);

    BOOST_CHECK_NE(lcca2, "World");
    BOOST_CHECK_NE(lcca2, rca1);
    BOOST_CHECK_NE(lcca2, rcca2);
    BOOST_CHECK_NE(lcca2, rccp3);
    BOOST_CHECK_NE(lcca2, rccpc4);

    BOOST_CHECK_NE(lccp3, "World");
    BOOST_CHECK_NE(lccp3, rca1);
    BOOST_CHECK_NE(lccp3, rcca2);
    BOOST_CHECK_NE(lccp3, rccp3);
    BOOST_CHECK_NE(lccp3, rccpc4);

    BOOST_CHECK_NE(lccpc4, "World");
    BOOST_CHECK_NE(lccpc4, rca1);
    BOOST_CHECK_NE(lccpc4, rcca2);
    BOOST_CHECK_NE(lccpc4, rccp3);
    BOOST_CHECK_NE(lccpc4, rccpc4);
}